

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O2

void __thiscall HTTPResponse::parse(HTTPResponse *this)

{
  string *this_00;
  _List_node_base *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_70,&this->version," ");
  std::operator+(&local_90,&local_70,&this->status);
  std::operator+(&local_50,&local_90,"\r\n");
  this_00 = &this->raw;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  p_Var1 = (_List_node_base *)&this->header;
  while (p_Var1 = (((_List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->header) {
    std::operator+(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 3)
                   ,": ");
    std::operator+(&local_90,&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1)
                  );
    std::operator+(&local_50,&local_90,"\r\n");
    std::__cxx11::string::append((string *)this_00);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::append((char *)this_00);
  std::__cxx11::string::append((string *)this_00);
  return;
}

Assistant:

void HTTPResponse::parse() {
    this->raw = this->version + " " + this->status + "\r\n";
    for (auto && item : this->header) {
        this->raw += std::get<0>(item) + ": " + std::get<1>(item) + "\r\n";
    }
    this->raw += "\r\n";
    this->raw += this->data;
}